

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O2

BranchLayerParams * __thiscall
CoreML::Specification::NeuralNetworkLayer::mutable_branch(NeuralNetworkLayer *this)

{
  LayerUnion this_00;
  
  if (this->_oneof_case_[0] == 0x25d) {
    this_00 = this->layer_;
  }
  else {
    clear_layer(this);
    this->_oneof_case_[0] = 0x25d;
    this_00.convolution_ = (ConvolutionLayerParams *)operator_new(0x28);
    BranchLayerParams::BranchLayerParams(this_00.branch_);
    (this->layer_).branch_ = (BranchLayerParams *)this_00;
  }
  return (BranchLayerParams *)this_00.convolution_;
}

Assistant:

inline ::CoreML::Specification::BranchLayerParams* NeuralNetworkLayer::mutable_branch() {
  if (!has_branch()) {
    clear_layer();
    set_has_branch();
    layer_.branch_ = new ::CoreML::Specification::BranchLayerParams;
  }
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.NeuralNetworkLayer.branch)
  return layer_.branch_;
}